

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# programEntity.c
# Opt level: O0

void sysbvm_programEntity_recordChild
               (sysbvm_context_t *context,sysbvm_tuple_t programEntity,sysbvm_tuple_t child)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  sysbvm_programEntityWithChildren_t *programEntityWithChildrenObject;
  sysbvm_tuple_t child_local;
  sysbvm_tuple_t programEntity_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isKindOf
                    (context,programEntity,(context->roots).programEntityWithChildrenType);
  if ((_Var1) && (programEntity != child)) {
    if (*(long *)(programEntity + 0x28) == 0) {
      sVar2 = sysbvm_orderedCollection_create(context);
      *(sysbvm_tuple_t *)(programEntity + 0x28) = sVar2;
    }
    sysbvm_orderedCollection_add(context,*(sysbvm_tuple_t *)(programEntity + 0x28),child);
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_programEntity_recordChild(sysbvm_context_t *context, sysbvm_tuple_t programEntity, sysbvm_tuple_t child)
{
    if(!sysbvm_tuple_isKindOf(context, programEntity, context->roots.programEntityWithChildrenType)) return;
    if(programEntity == child) return;

    sysbvm_programEntityWithChildren_t *programEntityWithChildrenObject = (sysbvm_programEntityWithChildren_t*)programEntity;
    if(!programEntityWithChildrenObject->children)
        programEntityWithChildrenObject->children = sysbvm_orderedCollection_create(context);
    sysbvm_orderedCollection_add(context, programEntityWithChildrenObject->children, child);
}